

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphs.cpp
# Opt level: O0

void __thiscall Pattern::readPatterNodesFromFile(Pattern *this,string *inputFile)

{
  byte bVar1;
  ostream *poVar2;
  size_type sVar3;
  reference pvVar4;
  char *__nptr;
  int local_330;
  allocator local_329;
  string local_328 [32];
  string local_308 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  string local_2d0 [32];
  undefined4 local_2b0;
  allocator local_2a9;
  string local_2a8 [32];
  string local_288 [32];
  undefined1 local_268 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  string local_240 [8];
  string line;
  istream local_220 [8];
  ifstream is;
  string *inputFile_local;
  Pattern *this_local;
  
  std::ifstream::ifstream(local_220,inputFile,8);
  std::__cxx11::string::string(local_240);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_240);
    while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
      std::__cxx11::string::string(local_288,local_240);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a8,"\t",&local_2a9);
      split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_268,(string *)local_288,(string *)local_2a8);
      std::__cxx11::string::~string(local_2a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
      std::__cxx11::string::~string(local_288);
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_268);
      if (sVar3 < 3) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_240);
        local_2b0 = 2;
      }
      else {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_268,0);
        std::__cxx11::string::string(local_2d0,(string *)pvVar4);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_268,1);
        std::__cxx11::string::string(local_308,(string *)pvVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_328,"&",&local_329);
        split(&local_2e8,(string *)local_308,(string *)local_328);
        Graph::insertNode(&this->super_Graph,(string *)local_2d0,&local_2e8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2e8);
        std::__cxx11::string::~string(local_328);
        std::allocator<char>::~allocator((allocator<char> *)&local_329);
        std::__cxx11::string::~string(local_308);
        std::__cxx11::string::~string(local_2d0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_268,2);
        __nptr = (char *)std::__cxx11::string::c_str();
        local_330 = atoi(__nptr);
        std::vector<int,_std::allocator<int>_>::push_back(&this->weight,&local_330);
        std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_240);
        local_2b0 = 0;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_268);
    }
    std::ifstream::close();
    std::__cxx11::string::~string(local_240);
    std::ifstream::~ifstream(local_220);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)inputFile);
  poVar2 = std::operator<<(poVar2,"open failed");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  exit(100);
}

Assistant:

void Pattern::readPatterNodesFromFile(string inputFile) {
    ifstream is(inputFile);
    string line;

    if (!is.is_open()) {
        cout << inputFile << "open failed" << endl;
        exit(100);
    }

    getline(is, line);

    while (!is.eof()) {
        vector<string> v = split(line, "\t");
        if (v.size() < 3) {
            getline(is, line);
            continue;
        }

        this->insertNode(v[0], split(v[1], "&"));
        weight.push_back(atoi(v[2].c_str()));
        getline(is, line);
    }
    is.close();
}